

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3CacheDeferredDoclists(Fts3Cursor *pCsr)

{
  bool bVar1;
  int iVar2;
  PendingList **pp;
  uchar *z;
  long *in_RDI;
  long in_FS_OFFSET;
  Fts3PhraseToken *pPT;
  char *zText;
  sqlite3_tokenizer_module *pModule;
  sqlite3_tokenizer *pT;
  Fts3Table *p;
  Fts3DeferredToken *pDef;
  sqlite3_int64 iDocid;
  int i;
  int iPos;
  int iDum2;
  int iDum1;
  int nToken;
  char *zToken;
  sqlite3_tokenizer_cursor *pTC;
  int rc;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  PendingList **in_stack_ffffffffffffff88;
  sqlite3_tokenizer_module *pRc;
  sqlite3_tokenizer *pTokenizer;
  long lVar4;
  long *iDocid_00;
  int local_3c;
  int local_30 [4];
  char *local_20;
  sqlite3_tokenizer_cursor *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  if (in_RDI[5] != 0) {
    lVar4 = *in_RDI;
    pTokenizer = *(sqlite3_tokenizer **)(lVar4 + 0x48);
    pRc = pTokenizer->pModule;
    pp = (PendingList **)
         sqlite3_column_int64
                   ((sqlite3_stmt *)
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT15(in_stack_ffffffffffffff85,
                                               CONCAT14(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80)))),
                    in_stack_ffffffffffffff7c);
    for (local_3c = 0; bVar1 = local_3c < *(int *)(lVar4 + 0x30), uVar3 = bVar1 && local_c == 0,
        bVar1 && local_c == 0; local_3c = local_3c + 1) {
      if (*(char *)(*(long *)(lVar4 + 0x40) + (long)local_3c) == '\0') {
        z = sqlite3_column_text((sqlite3_stmt *)
                                CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                        CONCAT15(in_stack_ffffffffffffff85,
                                                                 CONCAT14(in_stack_ffffffffffffff84,
                                                                          in_stack_ffffffffffffff80)
                                                                ))),in_stack_ffffffffffffff7c);
        local_18 = (sqlite3_tokenizer_cursor *)0x0;
        local_c = sqlite3Fts3OpenTokenizer
                            (pTokenizer,(int)((ulong)pRc >> 0x20),(char *)z,
                             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                             (sqlite3_tokenizer_cursor **)
                             CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(in_stack_ffffffffffffff85,
                                                              CONCAT14(in_stack_ffffffffffffff84,
                                                                       in_stack_ffffffffffffff80))))
                            );
        while (local_c == 0) {
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_30[3] = 0;
          local_30[2] = 0;
          local_30[1] = 0;
          local_30[0] = 0;
          local_c = (*pRc->xNext)(local_18,&local_20,local_30 + 3,local_30 + 2,local_30 + 1,local_30
                                 );
          for (iDocid_00 = (long *)in_RDI[5];
              in_stack_ffffffffffffff86 = iDocid_00 != (long *)0x0 && local_c == 0,
              iDocid_00 != (long *)0x0 && local_c == 0; iDocid_00 = (long *)iDocid_00[2]) {
            in_stack_ffffffffffffff88 = (PendingList **)*iDocid_00;
            if (((((*(int *)(lVar4 + 0x30) <= (int)iDocid_00[1]) || ((int)iDocid_00[1] == local_3c))
                 && ((*(int *)(in_stack_ffffffffffffff88 + 2) == 0 || (local_30[0] == 0)))) &&
                ((*(int *)(in_stack_ffffffffffffff88 + 1) == local_30[3] ||
                 ((*(int *)((long)in_stack_ffffffffffffff88 + 0xc) != 0 &&
                  (*(int *)(in_stack_ffffffffffffff88 + 1) < local_30[3])))))) &&
               (iVar2 = memcmp(local_20,*in_stack_ffffffffffffff88,
                               (long)*(int *)(in_stack_ffffffffffffff88 + 1)), iVar2 == 0)) {
              fts3PendingListAppend
                        (pp,(sqlite3_int64)iDocid_00,lVar4,(sqlite3_int64)pTokenizer,&pRc->iVersion)
              ;
            }
          }
        }
        if (local_18 != (sqlite3_tokenizer_cursor *)0x0) {
          (*pRc->xClose)(local_18);
        }
        if (local_c == 0x65) {
          local_c = 0;
        }
      }
    }
    for (lVar4 = in_RDI[5]; lVar4 != 0 && local_c == 0; lVar4 = *(long *)(lVar4 + 0x10)) {
      if (*(long *)(lVar4 + 0x18) != 0) {
        local_c = fts3PendingListAppendVarint
                            (in_stack_ffffffffffffff88,
                             CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(lVar4 != 0 && local_c == 0,
                                                              CONCAT14(in_stack_ffffffffffffff84,
                                                                       in_stack_ffffffffffffff80))))
                            );
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3CacheDeferredDoclists(Fts3Cursor *pCsr){
  int rc = SQLITE_OK;             /* Return code */
  if( pCsr->pDeferred ){
    int i;                        /* Used to iterate through table columns */
    sqlite3_int64 iDocid;         /* Docid of the row pCsr points to */
    Fts3DeferredToken *pDef;      /* Used to iterate through deferred tokens */

    Fts3Table *p = (Fts3Table *)pCsr->base.pVtab;
    sqlite3_tokenizer *pT = p->pTokenizer;
    sqlite3_tokenizer_module const *pModule = pT->pModule;

    assert( pCsr->isRequireSeek==0 );
    iDocid = sqlite3_column_int64(pCsr->pStmt, 0);

    for(i=0; i<p->nColumn && rc==SQLITE_OK; i++){
      if( p->abNotindexed[i]==0 ){
        const char *zText = (const char *)sqlite3_column_text(pCsr->pStmt, i+1);
        sqlite3_tokenizer_cursor *pTC = 0;

        rc = sqlite3Fts3OpenTokenizer(pT, pCsr->iLangid, zText, -1, &pTC);
        while( rc==SQLITE_OK ){
          char const *zToken;       /* Buffer containing token */
          int nToken = 0;           /* Number of bytes in token */
          int iDum1 = 0, iDum2 = 0; /* Dummy variables */
          int iPos = 0;             /* Position of token in zText */

          rc = pModule->xNext(pTC, &zToken, &nToken, &iDum1, &iDum2, &iPos);
          for(pDef=pCsr->pDeferred; pDef && rc==SQLITE_OK; pDef=pDef->pNext){
            Fts3PhraseToken *pPT = pDef->pToken;
            if( (pDef->iCol>=p->nColumn || pDef->iCol==i)
                && (pPT->bFirst==0 || iPos==0)
                && (pPT->n==nToken || (pPT->isPrefix && pPT->n<nToken))
                && (0==memcmp(zToken, pPT->z, pPT->n))
              ){
              fts3PendingListAppend(&pDef->pList, iDocid, i, iPos, &rc);
            }
          }
        }
        if( pTC ) pModule->xClose(pTC);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
      }
    }

    for(pDef=pCsr->pDeferred; pDef && rc==SQLITE_OK; pDef=pDef->pNext){
      if( pDef->pList ){
        rc = fts3PendingListAppendVarint(&pDef->pList, 0);
      }
    }
  }

  return rc;
}